

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O2

void duckdb_bind_set_cardinality(duckdb_bind_info info,idx_t cardinality,bool is_exact)

{
  pointer __p;
  idx_t local_20;
  pointer local_18;
  
  if (info != (duckdb_bind_info)0x0) {
    local_20 = cardinality;
    if (is_exact) {
      duckdb::make_uniq<duckdb::NodeStatistics,unsigned_long&>((duckdb *)&local_18,&local_20);
    }
    else {
      duckdb::make_uniq<duckdb::NodeStatistics,unsigned_long&,unsigned_long&>
                ((duckdb *)&local_18,&local_20,&local_20);
    }
    __p = local_18;
    local_18 = (pointer)0x0;
    std::__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
    reset((__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
          (*(long *)(info + 0x20) + 0x38),__p);
    std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
                &local_18);
  }
  return;
}

Assistant:

void duckdb_bind_set_cardinality(duckdb_bind_info info, idx_t cardinality, bool is_exact) {
	if (!info) {
		return;
	}
	auto &bind_info = GetCBindInfo(info);
	if (is_exact) {
		bind_info.bind_data.stats = duckdb::make_uniq<duckdb::NodeStatistics>(cardinality);
	} else {
		bind_info.bind_data.stats = duckdb::make_uniq<duckdb::NodeStatistics>(cardinality, cardinality);
	}
}